

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

size_t __thiscall AutoFile::detail_fread(AutoFile *this,Span<std::byte> dst)

{
  byte *pbVar1;
  long lVar2;
  pointer pbVar3;
  pointer pbVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)this->m_file == (FILE *)0x0) {
    pcVar6 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar6,(error_code *)"AutoFile::read: file handle is nullptr");
LAB_0040a1fb:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    sVar5 = fread(dst.m_data,1,dst.m_size,(FILE *)this->m_file);
    pbVar3 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar4 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar3 != pbVar4) {
      if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == false) {
        pcVar6 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar6,(error_code *)"AutoFile::read: position unknown");
        goto LAB_0040a1fb;
      }
      if (sVar5 != 0) {
        uVar8 = (long)pbVar4 - (long)pbVar3;
        sVar9 = 0;
        uVar7 = (ulong)(this->m_position).super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long>._M_payload._M_value % uVar8;
        do {
          pbVar1 = dst.m_data + sVar9;
          *pbVar1 = *pbVar1 ^ pbVar3[uVar7];
          uVar7 = uVar7 + 1;
          if (uVar7 == uVar8) {
            uVar7 = 0;
          }
          sVar9 = sVar9 + 1;
        } while (sVar5 != sVar9);
      }
    }
    if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value =
           (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload._M_value + sVar5;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return sVar5;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::size_t AutoFile::detail_fread(Span<std::byte> dst)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::read: file handle is nullptr");
    size_t ret = std::fread(dst.data(), 1, dst.size(), m_file);
    if (!m_xor.empty()) {
        if (!m_position.has_value()) throw std::ios_base::failure("AutoFile::read: position unknown");
        util::Xor(dst.subspan(0, ret), m_xor, *m_position);
    }
    if (m_position.has_value()) *m_position += ret;
    return ret;
}